

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.h
# Opt level: O3

void __thiscall
Rml::AnimationKey::AnimationKey(AnimationKey *this,float time,Property *property,Tween tween)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  PropertyDefinition *pPVar2;
  int iVar3;
  
  this->time = time;
  Variant::Variant(&(this->property).value,&property->value);
  (this->property).parser_index = property->parser_index;
  iVar3 = property->specificity;
  pPVar2 = property->definition;
  (this->property).unit = property->unit;
  (this->property).specificity = iVar3;
  (this->property).definition = pPVar2;
  (this->property).source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (property->source).
           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (property->source).
           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->property).source.super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->tween).type_in = (int)tween._0_8_;
  (this->tween).type_out = (int)((ulong)tween._0_8_ >> 0x20);
  (this->tween).callback = tween.callback;
  return;
}

Assistant:

AnimationKey(float time, const Property& property, Tween tween) : time(time), property(property), tween(tween) {}